

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O1

void __thiscall InjectPayloadCallfixup::restoreXml(InjectPayloadCallfixup *this,Element *el)

{
  Element *el_00;
  int iVar1;
  string *psVar2;
  LowlevelError *this_00;
  pointer ppEVar3;
  bool bVar4;
  string local_68;
  InjectPayloadCallfixup *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  Element::getAttributeValue(el,&local_68);
  psVar2 = &(local_48->super_InjectPayloadSleigh).super_InjectPayload.name;
  std::__cxx11::string::_M_assign((string *)psVar2);
  local_40 = psVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ppEVar3 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar3 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_38 = &local_48->targetSymbolNames;
    bVar4 = false;
    do {
      el_00 = *ppEVar3;
      iVar1 = std::__cxx11::string::compare((char *)el_00);
      if (iVar1 == 0) {
        InjectPayloadSleigh::restoreXml(&local_48->super_InjectPayloadSleigh,el_00);
        bVar4 = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)el_00);
        if (iVar1 == 0) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
          psVar2 = Element::getAttributeValue(el_00,&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_38,psVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
        }
      }
      ppEVar3 = ppEVar3 + 1;
    } while (ppEVar3 !=
             (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (bVar4) {
      return;
    }
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_68,"<callfixup> is missing <pcode> subtag: ",local_40);
  LowlevelError::LowlevelError(this_00,&local_68);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void InjectPayloadCallfixup::restoreXml(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  name = el->getAttributeValue("name");
  bool pcodeSubtag = false;

  for(iter=list.begin();iter!=list.end();++iter) {
    const Element *subel = *iter;
    if (subel->getName() == "pcode") {
      InjectPayloadSleigh::restoreXml(subel);
      pcodeSubtag = true;
    }
    else if (subel->getName() == "target")
      targetSymbolNames.push_back(subel->getAttributeValue("name"));
  }
  if (!pcodeSubtag)
    throw LowlevelError("<callfixup> is missing <pcode> subtag: "+name);
}